

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O1

string * __thiscall
chatra::toString_abi_cxx11_
          (string *__return_storage_ptr__,chatra *this,StringTable *sTable,ArgumentSpec *arg)

{
  long lVar1;
  __buckets_ptr pp_Var2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((ulong)sTable->baseVersion != 0xffffffff) {
    lVar3 = (ulong)sTable->baseVersion * 0x20;
    lVar1 = *(long *)(*(long *)(this + 0x40) + lVar3);
    local_50 = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,lVar1,*(long *)(*(long *)(this + 0x40) + 8 + lVar3) + lVar1);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
  }
  pp_Var2 = (sTable->strToId)._M_h._M_buckets;
  if (pp_Var2 != (__buckets_ptr)0x0) {
    lVar3 = (ulong)*(uint *)(pp_Var2 + 2) * 0x20;
    lVar1 = *(long *)(*(long *)(this + 0x40) + lVar3);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,lVar1,*(long *)(*(long *)(this + 0x40) + 8 + lVar3) + lVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1d0592);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const StringTable* sTable, const ArgumentSpec& arg) {
	std::string ret;
	if (arg.key != StringId::Invalid)
		ret += sTable->ref(arg.key);
	if (arg.cl != nullptr)
		ret += ":" + sTable->ref(arg.cl->getName());
	return ret;
}